

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.c
# Opt level: O3

void exchangeIntMat(char **mat,char *bufIn,char *bufOut,lattice *grid,MPI_Comm Region)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int next;
  ulong local_68;
  MPI_Comm local_60;
  int prev;
  char *local_50;
  MPI_Status st;
  
  if (Region != (MPI_Comm)&ompi_mpi_comm_world) {
    local_68 = (ulong)(uint)grid->deli;
    iVar4 = grid->delj + 2;
    local_50 = bufOut;
    MPI_Cart_shift(Region,0,1,&prev,&next);
    if (-1 < prev) {
      MPI_Sendrecv(mat[1],iVar4,&ompi_mpi_char,prev,0x65,*mat,iVar4,&ompi_mpi_char,prev,0x66,Region,
                   &st);
    }
    if (-1 < next) {
      MPI_Sendrecv(mat[grid->deli],iVar4,&ompi_mpi_char,next,0x66,mat[(long)grid->deli + 1],iVar4,
                   &ompi_mpi_char,next,0x65,Region,&st);
    }
    uVar5 = (int)local_68 + 2;
    local_60 = Region;
    MPI_Cart_shift(Region,1,1,&prev,&next);
    pcVar1 = local_50;
    if (-1 < prev) {
      if ((int)local_68 < -1) {
        MPI_Sendrecv(bufIn,uVar5,&ompi_mpi_char,prev,0x67,local_50,uVar5,&ompi_mpi_char,prev,0x68,
                     local_60,&st);
      }
      else {
        uVar2 = 1;
        if (1 < (int)uVar5) {
          uVar2 = (ulong)uVar5;
        }
        uVar3 = 0;
        do {
          bufIn[uVar3] = mat[uVar3][1];
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
        MPI_Sendrecv(bufIn,uVar5,&ompi_mpi_char,prev,0x67,local_50,uVar5,&ompi_mpi_char,prev,0x68,
                     local_60,&st);
        if (-2 < (int)local_68) {
          uVar2 = 1;
          if (1 < (int)uVar5) {
            uVar2 = (ulong)uVar5;
          }
          uVar3 = 0;
          do {
            *mat[uVar3] = pcVar1[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
      }
    }
    if (-1 < next) {
      if ((int)local_68 < -1) {
        MPI_Sendrecv(bufIn,uVar5,&ompi_mpi_char,next,0x68,pcVar1,uVar5,&ompi_mpi_char,next,0x67,
                     local_60,&st);
      }
      else {
        uVar2 = 1;
        if (1 < (int)uVar5) {
          uVar2 = (ulong)uVar5;
        }
        uVar3 = 0;
        do {
          bufIn[uVar3] = mat[uVar3][grid->delj];
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
        MPI_Sendrecv(bufIn,uVar5,&ompi_mpi_char,next,0x68,pcVar1,uVar5,&ompi_mpi_char,next,0x67,
                     local_60,&st);
        if (-2 < (int)local_68) {
          uVar2 = 1;
          if (1 < (int)uVar5) {
            uVar2 = (ulong)uVar5;
          }
          uVar3 = 0;
          do {
            mat[uVar3][(long)grid->delj + 1] = pcVar1[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void exchangeIntMat (char **mat, char *bufIn, char *bufOut, lattice *grid, MPI_Comm Region)
{
	if (Region == MPI_COMM_WORLD)
		return;
	int prev, next;
	MPI_Status st;
	int lx = grid->deli+2;
	int ly = grid->delj+2;
	/* Left and right */
	MPI_Cart_shift(Region,0,1,&prev,&next);
	if (prev >= 0)
		MPI_Sendrecv(mat[1],ly,MPI_CHAR,prev,101,mat[0],ly,MPI_CHAR,prev,102,Region,&st);
	if (next >= 0)
		MPI_Sendrecv(mat[grid->deli],ly,MPI_CHAR,next,102,mat[grid->deli+1],ly,MPI_CHAR,next,101,Region,&st);
	/* Up and Down */
	MPI_Cart_shift(Region,1,1,&prev,&next);
	if (prev >= 0)
	{
		for (int i = 0; i < lx; i++)
			bufIn[i] = mat[i][1];
		MPI_Sendrecv(bufIn,lx,MPI_CHAR,prev,103,bufOut,lx,MPI_CHAR,prev,104,Region,&st);
		for (int i = 0; i < lx; i++)
			mat[i][0] = bufOut[i];
	}
	if (next >= 0)
	{
		for (int i = 0; i < lx; i++)
			bufIn[i] = mat[i][grid->delj];
		MPI_Sendrecv(bufIn,lx,MPI_CHAR,next,104,bufOut,lx,MPI_CHAR,next,103,Region,&st);
		for (int i = 0; i < lx; i++)
			mat[i][grid->delj+1] = bufOut[i];
	}
	return;
}